

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O1

void __thiscall Document::append_paragraph(Document *this,Paragraph *p)

{
  pointer *pppPVar1;
  pointer ppPVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  size_t sVar5;
  Paragraph *this_00;
  bool local_21;
  Paragraph *local_20;
  
  ppPVar2 = (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppPVar2 ==
      (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = (Paragraph *)0x0;
  }
  else {
    this_00 = ppPVar2[-1];
  }
  local_20 = p;
  if (this_00 != (Paragraph *)0x0) {
    iVar3 = (*p->_vptr_Paragraph[1])(p);
    iVar4 = (*this_00->_vptr_Paragraph[1])(this_00);
    if (iVar3 < iVar4) {
      local_21 = true;
      Paragraph::last(this_00,&local_21);
    }
  }
  if (local_20 != (Paragraph *)0x0) {
    sVar5 = Paragraph::size(local_20);
    if (sVar5 != 0) {
      __position._M_current =
           (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Paragraph*,std::allocator<Paragraph*>>::_M_realloc_insert<Paragraph*const&>
                  ((vector<Paragraph*,std::allocator<Paragraph*>> *)&this->_paragraph,__position,
                   &local_20);
      }
      else {
        *__position._M_current = local_20;
        pppPVar1 = &(this->_paragraph).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void Document::append_paragraph(Paragraph * p) {
	Paragraph *last_p(nullptr);

	if (_paragraph.size()) {
		last_p = _paragraph.back();
	}

	if (last_p and p->level() < last_p->level()) {
		last_p->last(true);
	}

	if (p and p->size()) {
		_paragraph.push_back(p);
	}
}